

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O0

int nn_ws_optset_getopt(nn_optset *self,int option,void *optval,size_t *optvallen)

{
  ulong *in_RCX;
  void *in_RDX;
  int in_ESI;
  long in_RDI;
  nn_ws_optset *optset;
  undefined8 local_50;
  undefined8 local_38;
  undefined4 local_4;
  
  local_38 = in_RDI;
  if (in_RDI == 0) {
    local_38 = 0;
  }
  if (in_ESI == 1) {
    if (*in_RCX < 4) {
      local_50 = *in_RCX;
    }
    else {
      local_50 = 4;
    }
    memcpy(in_RDX,(void *)(local_38 + 8),local_50);
    *in_RCX = 4;
    local_4 = 0;
  }
  else {
    local_4 = -0x5c;
  }
  return local_4;
}

Assistant:

static int nn_ws_optset_getopt (struct nn_optset *self, int option,
    void *optval, size_t *optvallen)
{
    struct nn_ws_optset *optset;

    optset = nn_cont (self, struct nn_ws_optset, base);

    switch (option) {
    case NN_WS_MSG_TYPE:
        memcpy (optval, &optset->msg_type,
            *optvallen < sizeof (int) ? *optvallen : sizeof (int));
        *optvallen = sizeof (int);
        return 0;
    default:
        return -ENOPROTOOPT;
    }
}